

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcTopologyRepresentation::IfcTopologyRepresentation
          (IfcTopologyRepresentation *this)

{
  IfcTopologyRepresentation *this_local;
  
  STEP::Object::Object
            ((Object *)&(this->super_IfcShapeModel).field_0xa0,"IfcTopologyRepresentation");
  IfcShapeModel::IfcShapeModel(&this->super_IfcShapeModel,&PTR_construction_vtable_24__01053e50);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcTopologyRepresentation,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcTopologyRepresentation,_0UL> *)
             &(this->super_IfcShapeModel).super_IfcRepresentation.field_0x90,
             &PTR_construction_vtable_24__01053e98);
  (this->super_IfcShapeModel).super_IfcRepresentation.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>._vptr_ObjectHelper =
       (_func_int **)0x1053dc0;
  *(undefined8 *)&(this->super_IfcShapeModel).field_0xa0 = 0x1053e38;
  *(undefined8 *)&(this->super_IfcShapeModel).super_IfcRepresentation.field_0x80 = 0x1053de8;
  *(undefined8 *)&(this->super_IfcShapeModel).super_IfcRepresentation.field_0x90 = 0x1053e10;
  return;
}

Assistant:

IfcTopologyRepresentation() : Object("IfcTopologyRepresentation") {}